

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-example2.c
# Opt level: O0

void decode(FILE *inputFile,FILE *outputFile)

{
  rcnb_decodestate *__ws;
  wchar_t *code_in;
  wchar_t *pwVar1;
  size_t __n;
  FILE *in_RSI;
  __FILE *in_RDI;
  size_t cnt;
  rcnb_decodestate ds;
  char *decoded;
  wchar_t *encoded;
  wchar_t size;
  rcnb_decodestate *in_stack_ffffffffffffffb0;
  char *plaintext_out;
  rcnb_decodestate *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  __ws = (rcnb_decodestate *)malloc(0x4b0);
  code_in = (wchar_t *)malloc(100);
  plaintext_out = (char *)0x0;
  rcnb_init_decodestate((rcnb_decodestate *)&stack0xffffffffffffffc0);
  while( true ) {
    pwVar1 = fgetws((wchar_t *)__ws,100,in_RDI);
    if (pwVar1 == (wchar_t *)0x0) break;
    in_stack_ffffffffffffffb0 = __ws;
    wcslen((wchar_t *)__ws);
    plaintext_out =
         (char *)rcnb_decode_block(code_in,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                   in_stack_ffffffffffffffc0);
    fwrite(code_in,1,(size_t)plaintext_out,in_RSI);
  }
  __n = rcnb_decode_blockend(plaintext_out,in_stack_ffffffffffffffb0);
  fwrite(code_in,1,__n,in_RSI);
  free(__ws);
  free(code_in);
  return;
}

Assistant:

void decode(FILE* inputFile, FILE* outputFile)
{
    /* set up a destination buffer large enough to hold the decoded data */
    int size = SIZE;
    wchar_t* encoded = (wchar_t*)malloc(3 * size * sizeof(wchar_t));
    char* decoded = (char*)malloc(size); /* ~1/2 x encoded */
    /* we need an encoder and decoder state */
    rcnb_decodestate ds;
    /* store the number of bytes encoded by a single call */
    size_t cnt = 0;

    /*---------- START DECODING ----------*/
    /* initialise the encoder state */
    rcnb_init_decodestate(&ds);
    /* gather data from the input and send it to the output */
    while (fgetws(encoded, size, inputFile))
    {
        cnt = rcnb_decode_block(encoded, wcslen(encoded), decoded, &ds);
        /* output the encoded bytes to the output file */
        fwrite(decoded, sizeof(char), cnt, outputFile);
    }
    /* since we have reached the end of the input file, we know that
       there is no more input data; finalise the decoding */
    cnt = rcnb_decode_blockend(decoded, &ds);
    /* write the last bytes to the output file */
    fwrite(decoded, sizeof(char), cnt, outputFile);
    /*---------- STOP DECODING  ----------*/

    free(encoded);
    free(decoded);
}